

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicPlatformDebug.cpp
# Opt level: O3

String * __thiscall
Diligent::BasicPlatformDebug::FormatAssertionFailedMessage_abi_cxx11_
          (String *__return_storage_ptr__,BasicPlatformDebug *this,char *Message,char *Function,
          char *File,int Line)

{
  char **Args_7;
  allocator local_65;
  int Line_local;
  char *Function_local;
  char *Message_local;
  String FileName;
  String local_30;
  
  Line_local = (int)File;
  FileName._M_string_length = 0;
  FileName.field_2._M_local_buf[0] = '\0';
  Function_local = Message;
  Message_local = (char *)this;
  FileName._M_dataplus._M_p = (pointer)&FileName.field_2;
  std::__cxx11::string::string((string *)&local_30,Function,&local_65);
  Args_7 = (char **)0x51cd45;
  BasicFileSystem::GetPathComponents(&local_30,(String *)0x0,&FileName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    Args_7 = (char **)0x51cd60;
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  FormatString<char[27],char_const*,char[10],std::__cxx11::string,char[8],int,char[3],char_const*>
            (__return_storage_ptr__,(Diligent *)"Debug assertion failed in ",
             (char (*) [27])&Function_local,(char **)"(), file ",(char (*) [10])&FileName,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", line ",
             (char (*) [8])&Line_local,(int *)0x74fafb,(char (*) [3])&Message_local,Args_7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)FileName._M_dataplus._M_p != &FileName.field_2) {
    operator_delete(FileName._M_dataplus._M_p,
                    CONCAT71(FileName.field_2._M_allocated_capacity._1_7_,
                             FileName.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

String BasicPlatformDebug::FormatAssertionFailedMessage(const char* Message,
                                                        const char* Function, // type of __FUNCTION__
                                                        const char* File,     // type of __FILE__
                                                        int         Line)
{
    String FileName;
    BasicFileSystem::GetPathComponents(File, nullptr, &FileName);
    return FormatString("Debug assertion failed in ", Function, "(), file ", FileName, ", line ", Line, ":\n", Message);
}